

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

int proto_action_in_stage(proto_action *act,action_class stage)

{
  int iVar1;
  undefined4 in_ESI;
  int *in_RDI;
  uint local_4;
  
  switch(in_ESI) {
  case 1:
    if (*in_RDI == 6) {
      return 1;
    }
  case 0:
    iVar1 = *in_RDI;
    if ((iVar1 - 3U < 3) || (iVar1 == 9 || iVar1 == 10)) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
    break;
  case 2:
    local_4 = (uint)(*in_RDI == 1);
    break;
  case 3:
    local_4 = (uint)(*in_RDI == 0xb);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                  ,0x49a,"int proto_action_in_stage(proto_action *, action_class)");
  }
  return local_4;
}

Assistant:

static int
proto_action_in_stage(proto_action *act, action_class stage) {
    switch (stage) {
    case Immediate_and_Multi:
        if (act->action_type == Action_Multi) return 1;
        /* fallthrough */
    case Immediate:
        switch (act->action_type) {
        case Action_Terminal:
        case Action_Filter:
        case Action_Split:
        case Action_Immediate:
        case Action_Store:
            return 1;
        default:
            return 0;
        }
    case Bridge:
        return act->action_type == Action_Bridge;
    case Congestion:
        return act->action_type == Action_Congestion;
    default:
        assert(0);
    }
    return 0;
}